

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::PerfEventConfig_CallstackSampling::operator==
          (PerfEventConfig_CallstackSampling *this,PerfEventConfig_CallstackSampling *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  PerfEventConfig_CallstackSampling *other_local;
  PerfEventConfig_CallstackSampling *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = protozero::operator==(&this->scope_,&other->scope_);
    local_19 = false;
    if ((bVar2) && (local_19 = false, (this->kernel_frames_ & 1U) == (other->kernel_frames_ & 1U)))
    {
      local_19 = this->user_frames_ == other->user_frames_;
    }
  }
  return local_19;
}

Assistant:

bool PerfEventConfig_CallstackSampling::operator==(const PerfEventConfig_CallstackSampling& other) const {
  return unknown_fields_ == other.unknown_fields_
   && scope_ == other.scope_
   && kernel_frames_ == other.kernel_frames_
   && user_frames_ == other.user_frames_;
}